

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::BufferMemMap::BufferMemMap
          (BufferMemMap *this,Functions *gl,deUint32 target,int offset,int size,deUint32 access)

{
  GLenum err;
  deBool dVar1;
  void *pvVar2;
  TestError *this_00;
  deUint32 access_local;
  int size_local;
  int offset_local;
  deUint32 target_local;
  Functions *gl_local;
  BufferMemMap *this_local;
  
  this->m_gl = gl;
  this->m_target = target;
  this->m_ptr = (void *)0x0;
  pvVar2 = (*gl->mapBufferRange)(target,(long)offset,(long)size,access);
  this->m_ptr = pvVar2;
  err = (*gl->getError)();
  glu::checkError(err,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x3b);
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || (this->m_ptr == (void *)0x0)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x3c);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

BufferMemMap (const glw::Functions& gl, deUint32 target, int offset, int size, deUint32 access)
		: m_gl		(gl)
		, m_target	(target)
		, m_ptr		(DE_NULL)
	{
		m_ptr = gl.mapBufferRange(target, offset, size, access);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(m_ptr);
	}